

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastEvR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int value;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 data_00;
  ulong uVar9;
  ParseContext *extraout_RDX;
  ParseContext *ctx_00;
  ushort *puVar10;
  uint *puVar11;
  RepeatedField<int> *this;
  bool bVar12;
  
  if (data.field_0._0_2_ != 0) {
    pcVar6 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar6;
  }
  this = (RepeatedField<int> *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  uVar1 = *(ushort *)ptr;
  aVar8.data = (ulong)data.field_0 >> 0x18 & 0xff;
  puVar11 = *(uint **)((long)&table->has_bits_offset + aVar8.data * 8 + (ulong)table->aux_offset);
  ctx_00 = ctx;
  do {
    uVar5 = (ulong)(char)*(ushort *)((long)ptr + 2);
    if ((long)uVar5 < 0) {
      aVar8.data = (long)*(char *)((long)ptr + 3) << 7 | 0x7f;
      if ((long)aVar8 < 0) {
        ctx_00 = (ParseContext *)((long)(char)*(ushort *)((long)ptr + 4) << 0xe | 0x3fff);
        if ((long)ctx_00 < 0) {
          aVar8.data = aVar8.data & ((long)*(char *)((long)ptr + 5) << 0x15 | 0x1fffffU);
          if ((long)aVar8 < 0) {
            ctx_00 = (ParseContext *)
                     ((ulong)ctx_00 & ((long)(char)*(ushort *)((long)ptr + 6) << 0x1c | 0xfffffffU))
            ;
            if ((long)ctx_00 < 0) {
              aVar8.data = aVar8.data & ((long)*(char *)((long)ptr + 7) << 0x23 | 0x7ffffffffU);
              if ((long)aVar8 < 0) {
                ctx_00 = (ParseContext *)
                         ((ulong)ctx_00 &
                         ((long)(char)*(ushort *)((long)ptr + 8) << 0x2a | 0x3ffffffffffU));
                if ((long)ctx_00 < 0) {
                  aVar8.data = aVar8.data &
                               ((long)*(char *)((long)ptr + 9) << 0x31 | 0x1ffffffffffffU);
                  if ((long)aVar8 < 0) {
                    ctx_00 = (ParseContext *)
                             ((ulong)ctx_00 &
                             ((ulong)(byte)*(ushort *)((long)ptr + 10) << 0x38 | 0xffffffffffffff));
                    if ((long)ctx_00 < 0) {
                      puVar10 = (ushort *)((long)ptr + 0xc);
                      if (*(char *)((long)ptr + 0xb) != '\x01') {
                        if ((char)*(byte *)((long)ptr + 0xb) < '\0') {
                          puVar10 = (ushort *)0x0;
                          goto LAB_00153bee;
                        }
                        if ((*(byte *)((long)ptr + 0xb) & 1) == 0) {
                          ctx_00 = (ParseContext *)((ulong)ctx_00 ^ 0x8000000000000000);
                        }
                      }
                    }
                    else {
                      puVar10 = (ushort *)((long)ptr + 0xb);
                    }
                  }
                  else {
                    puVar10 = (ushort *)((long)ptr + 10);
                  }
                }
                else {
                  puVar10 = (ushort *)((long)ptr + 9);
                }
              }
              else {
                puVar10 = (ushort *)((long)ptr + 8);
              }
            }
            else {
              puVar10 = (ushort *)((long)ptr + 7);
            }
          }
          else {
            puVar10 = (ushort *)((long)ptr + 6);
          }
        }
        else {
          puVar10 = (ushort *)((long)ptr + 5);
        }
        aVar8.data = aVar8.data & (ulong)ctx_00;
      }
      else {
        puVar10 = (ushort *)((long)ptr + 4);
      }
      uVar5 = uVar5 & aVar8.data;
    }
    else {
      puVar10 = (ushort *)((long)ptr + 3);
    }
LAB_00153bee:
    if (puVar10 == (ushort *)0x0) {
      pcVar6 = Error(msg,ptr,ctx_00,(TcFieldData)aVar8,table,hasbits);
      return pcVar6;
    }
    uVar7 = (ulong)(*puVar11 >> 0x10);
    value = (int)uVar5;
    uVar5 = (long)value - (long)(short)*puVar11;
    uVar9 = uVar5 - uVar7;
    if (uVar7 <= uVar5) {
      uVar4 = puVar11[1];
      if (uVar9 < (uVar4 & 0xffff)) {
        data_00.data._4_4_ = 0;
        data_00.data._0_4_ = puVar11[(uVar9 >> 5) + 2];
        bVar12 = (puVar11[(uVar9 >> 5) + 2] >> ((uint)uVar9 & 0x1f) & 1) != 0;
LAB_00153caf:
        if (!bVar12) {
          pcVar6 = FastUnknownEnumFallback(msg,ptr,ctx,(TcFieldData)data_00,table,hasbits);
          return pcVar6;
        }
      }
      else {
        data_00.data = (long)puVar11 + (ulong)(uVar4 >> 3 & 0x1ffc) + 8;
        uVar5 = 0;
        do {
          bVar12 = uVar5 < uVar4 >> 0x10;
          if (!bVar12) goto LAB_00153caf;
          iVar3 = *(int *)(data_00.data + uVar5 * 4);
          uVar5 = (uVar5 * 2 - (ulong)(value < iVar3)) + 2;
        } while (iVar3 != value);
      }
    }
    RepeatedField<int>::Add(this,value);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar10) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar11 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar11 & 3) != 0) {
          AlignFail();
        }
        *puVar11 = *puVar11 | (uint)hasbits;
      }
      return (char *)puVar10;
    }
    uVar2 = *puVar10;
    aVar8.data._2_6_ = 0;
    aVar8.data._0_2_ = uVar2;
    ctx_00 = extraout_RDX;
    ptr = (char *)puVar10;
    if (uVar2 != uVar1) {
      uVar4 = (uint)table->fast_idx_mask & (uint)uVar2;
      if ((uVar4 & 7) == 0) {
        uVar5 = (ulong)(uVar4 & 0xfffffff8);
        pcVar6 = (char *)(**(code **)(&table[1].has_bits_offset + uVar5))
                                   (msg,puVar10,ctx,
                                    aVar8.data ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2),
                                    table,hasbits);
        return pcVar6;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEvR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedEnum<uint16_t, field_layout::kTvEnum>(
      PROTOBUF_TC_PARAM_PASS);
}